

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression *
soul::ExpressionHelpers::create
          (Expression *__return_storage_ptr__,Expression *e,StringDictionary *dictionary)

{
  SubscriptWithBrackets *pSVar1;
  SubscriptWithChevrons *pSVar2;
  DotOperator *pDVar3;
  string *psVar4;
  QualifiedIdentifier *q_00;
  Constant *pCVar5;
  TypeMetaFunction *pTVar6;
  char *__s;
  Expression *this;
  pool_ptr<soul::AST::QualifiedIdentifier> q;
  Expression result;
  pool_ptr<soul::AST::SubscriptWithBrackets> s;
  pool_ptr<soul::AST::DotOperator> d;
  allocator<char> local_34a;
  allocator<char> local_349;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  Expression local_328;
  UTF8Reader local_310;
  Expression local_308;
  Expression local_2f0;
  Expression local_2d8;
  Expression local_2c0;
  Expression local_2a8;
  Expression local_290;
  Expression local_278;
  Expression local_260;
  Expression local_248;
  Expression local_230;
  Expression local_218;
  Expression local_200;
  Expression local_1e8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  pool_ptr<soul::AST::Expression> local_90;
  string local_88;
  string local_68;
  pool_ptr<soul::AST::Expression> local_48;
  string local_40;
  
  cast<soul::AST::SubscriptWithBrackets,soul::AST::Expression>((soul *)&local_310,e);
  if (local_310.data == (char *)0x0) {
    cast<soul::AST::SubscriptWithChevrons,soul::AST::Expression>((soul *)&local_310,e);
    if (local_310.data == (char *)0x0) {
      cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_308,e);
      if (local_308.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)local_348._M_pod_data,e);
        if ((Expression *)local_348._M_unused._0_8_ != (Expression *)0x0) {
          q_00 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*
                           ((pool_ptr<soul::AST::QualifiedIdentifier> *)&local_348);
          fromIdentifier(__return_storage_ptr__,q_00);
          return __return_storage_ptr__;
        }
        cast<soul::AST::Constant,soul::AST::Expression>((soul *)local_348._M_pod_data,e);
        if ((Expression *)local_348._M_unused._0_8_ != (Expression *)0x0) {
          pCVar5 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&local_348);
          soul::Value::getDescription_abi_cxx11_(&local_110,&pCVar5->value,dictionary);
          createText(__return_storage_ptr__,&local_110);
          psVar4 = &local_110;
LAB_00285cce:
          std::__cxx11::string::~string((string *)psVar4);
          return __return_storage_ptr__;
        }
        cast<soul::AST::TypeMetaFunction,soul::AST::Expression>((soul *)&local_308,e);
        if (local_308.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          local_348._M_unused._M_object = &local_328;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_330 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                      ::_M_invoke;
          local_338 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                      ::_M_manager;
          local_348._8_8_ = e;
          catchParseErrors((function<void_()> *)&local_348);
          std::_Function_base::~_Function_base((_Function_base *)&local_348);
          if (local_328.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_328.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            SourceCodeUtilities::findRangeOfASTObject
                      ((CodeLocationRange *)&local_348,(ASTObject *)e);
            CodeLocationRange::toString_abi_cxx11_(&local_1d0,(CodeLocationRange *)&local_348);
            choc::text::trim(&local_1b0,&local_1d0);
            createText(__return_storage_ptr__,&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1d0);
            CodeLocationRange::~CodeLocationRange((CodeLocationRange *)&local_348);
          }
          else {
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          this = &local_328;
        }
        else {
          pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                             ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
          if (pTVar6->operation == makeReference) {
            pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                               ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
            create(&local_2a8,(pTVar6->source).object,dictionary);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"&",(allocator<char> *)&local_328);
            createText((Expression *)&local_348,&local_130);
            operator+(__return_storage_ptr__,&local_2a8,(Expression *)&local_348);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_348);
            std::__cxx11::string::~string((string *)&local_130);
            this = &local_2a8;
          }
          else {
            pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                               ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
            if (pTVar6->operation == makeConst) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,"const ",(allocator<char> *)&local_328);
              createKeyword(&local_2c0,&local_150);
              pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                                 ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
              create((Expression *)&local_348,(pTVar6->source).object,dictionary);
              operator+(__return_storage_ptr__,&local_2c0,(Expression *)&local_348);
              std::
              vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                         *)&local_348);
              std::
              vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ::~vector(&local_2c0.sections);
              psVar4 = &local_150;
              goto LAB_00285cce;
            }
            pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                               ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
            create(&local_2f0,(pTVar6->source).object,dictionary);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_170,".",(allocator<char> *)&local_310);
            createText((Expression *)&local_348,&local_170);
            operator+(&local_2d8,&local_2f0,(Expression *)&local_348);
            pTVar6 = pool_ptr<soul::AST::TypeMetaFunction>::operator->
                               ((pool_ptr<soul::AST::TypeMetaFunction> *)&local_308);
            __s = AST::TypeMetaFunction::getNameForOperation(pTVar6->operation);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,__s,&local_34a);
            createText(&local_328,&local_190);
            operator+(__return_storage_ptr__,&local_2d8,&local_328);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector(&local_328.sections);
            std::__cxx11::string::~string((string *)&local_190);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector(&local_2d8.sections);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_348);
            std::__cxx11::string::~string((string *)&local_170);
            this = &local_2f0;
          }
        }
      }
      else {
        pDVar3 = pool_ptr<soul::AST::DotOperator>::operator->
                           ((pool_ptr<soul::AST::DotOperator> *)&local_308);
        create(&local_290,(pDVar3->lhs).object,dictionary);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,".",(allocator<char> *)&local_310);
        createText((Expression *)&local_348,&local_d0);
        operator+(&local_278,&local_290,(Expression *)&local_348);
        pDVar3 = pool_ptr<soul::AST::DotOperator>::operator->
                           ((pool_ptr<soul::AST::DotOperator> *)&local_308);
        psVar4 = Identifier::toString_abi_cxx11_(&pDVar3->rhs->identifier);
        std::__cxx11::string::string((string *)&local_f0,(string *)psVar4);
        createText(&local_328,&local_f0);
        operator+(__return_storage_ptr__,&local_278,&local_328);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&local_328.sections);
        std::__cxx11::string::~string((string *)&local_f0);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&local_278.sections);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   *)&local_348);
        std::__cxx11::string::~string((string *)&local_d0);
        this = &local_290;
      }
    }
    else {
      pSVar2 = pool_ptr<soul::AST::SubscriptWithChevrons>::operator->
                         ((pool_ptr<soul::AST::SubscriptWithChevrons> *)&local_310);
      create(&local_260,(pSVar2->lhs).object,dictionary);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"<",&local_34a);
      createText((Expression *)&local_348,&local_88);
      operator+(&local_248,&local_260,(Expression *)&local_348);
      pSVar2 = pool_ptr<soul::AST::SubscriptWithChevrons>::operator->
                         ((pool_ptr<soul::AST::SubscriptWithChevrons> *)&local_310);
      local_90.object = (pSVar2->rhs).object;
      createIfNotNull(&local_328,&local_90,dictionary);
      operator+(&local_230,&local_248,&local_328);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,">",&local_349);
      createText(&local_308,&local_b0);
      operator+(__return_storage_ptr__,&local_230,&local_308);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_308.sections);
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_230.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_328.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_248.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)&local_348);
      std::__cxx11::string::~string((string *)&local_88);
      this = &local_260;
    }
  }
  else {
    pSVar1 = pool_ptr<soul::AST::SubscriptWithBrackets>::operator->
                       ((pool_ptr<soul::AST::SubscriptWithBrackets> *)&local_310);
    create(&local_218,(pSVar1->lhs).object,dictionary);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"[",&local_34a);
    createText((Expression *)&local_348,&local_40);
    operator+(&local_200,&local_218,(Expression *)&local_348);
    pSVar1 = pool_ptr<soul::AST::SubscriptWithBrackets>::operator->
                       ((pool_ptr<soul::AST::SubscriptWithBrackets> *)&local_310);
    local_48.object = (pSVar1->rhs).object;
    createIfNotNull(&local_328,&local_48,dictionary);
    operator+(&local_1e8,&local_200,&local_328);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"]",&local_349);
    createText(&local_308,&local_68);
    operator+(__return_storage_ptr__,&local_1e8,&local_308);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_308.sections);
    std::__cxx11::string::~string((string *)&local_68);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_1e8.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_328.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_200.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)&local_348);
    std::__cxx11::string::~string((string *)&local_40);
    this = &local_218;
  }
  std::
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ::~vector(&this->sections);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (AST::Expression& e, const StringDictionary& dictionary)
    {
        if (auto s = cast<AST::SubscriptWithBrackets> (e))  return create (s->lhs, dictionary) + createText ("[") + createIfNotNull (s->rhs, dictionary) + createText ("]");
        if (auto s = cast<AST::SubscriptWithChevrons> (e))  return create (s->lhs, dictionary) + createText ("<") + createIfNotNull (s->rhs, dictionary) + createText (">");
        if (auto d = cast<AST::DotOperator> (e))            return create (d->lhs, dictionary) + createText (".") + createText (d->rhs.identifier.toString());
        if (auto q = cast<AST::QualifiedIdentifier> (e))    return fromIdentifier (*q);
        if (auto c = cast<AST::Constant> (e))               return createText (c->value.getDescription (std::addressof (dictionary)));

        if (auto m = cast<AST::TypeMetaFunction> (e))
        {
            if (m->operation == AST::TypeMetaFunction::Op::makeReference)
                return create (m->source, dictionary) + createText ("&");

            if (m->operation == AST::TypeMetaFunction::Op::makeConst)
                return createKeyword ("const ") + create (m->source, dictionary);

            return create (m->source, dictionary) + createText (".") + createText (AST::TypeMetaFunction::getNameForOperation (m->operation));
        }

        SourceCodeModel::Expression result;
        catchParseErrors ([&] { result = create (e.resolveAsType()); });

        if (! result.sections.empty())
            return result;

        return createText (choc::text::trim (SourceCodeUtilities::findRangeOfASTObject (e).toString()));
    }